

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_str.c
# Opt level: O1

size_t ares_strcpy(char *dest,char *src,size_t dest_size)

{
  ulong uVar1;
  size_t __n;
  
  if (dest_size == 0 || dest == (char *)0x0) {
    __n = 0;
  }
  else {
    if (src == (char *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = strlen(src);
    }
    __n = dest_size - 1;
    if (uVar1 < dest_size) {
      __n = uVar1;
    }
    if (__n != 0) {
      memcpy(dest,src,__n);
    }
    dest[__n] = '\0';
  }
  return __n;
}

Assistant:

size_t ares_strcpy(char *dest, const char *src, size_t dest_size)
{
  size_t len = 0;

  if (dest == NULL || dest_size == 0) {
    return 0; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  len = ares_strlen(src);

  if (len >= dest_size) {
    len = dest_size - 1;
  }

  if (len) {
    memcpy(dest, src, len);
  }

  dest[len] = 0;
  return len;
}